

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

ClassMethodPrototypeSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ClassMethodPrototypeSyntax,slang::syntax::ClassMethodPrototypeSyntax_const&>
          (BumpAllocator *this,ClassMethodPrototypeSyntax *args)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  undefined4 uVar3;
  TokenKind TVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  ClassMethodPrototypeSyntax *pCVar8;
  
  pCVar8 = (ClassMethodPrototypeSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ClassMethodPrototypeSyntax *)this->endPtr < pCVar8 + 1) {
    pCVar8 = (ClassMethodPrototypeSyntax *)allocateSlow(this,0xa0,8);
  }
  else {
    this->head->current = (byte *)(pCVar8 + 1);
  }
  (pCVar8->super_MemberSyntax).super_SyntaxNode.previewNode =
       (args->super_MemberSyntax).super_SyntaxNode.previewNode;
  uVar3 = *(undefined4 *)&(args->super_MemberSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_MemberSyntax).super_SyntaxNode.parent;
  (pCVar8->super_MemberSyntax).super_SyntaxNode.kind =
       (args->super_MemberSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pCVar8->super_MemberSyntax).super_SyntaxNode.field_0x4 = uVar3;
  (pCVar8->super_MemberSyntax).super_SyntaxNode.parent = pSVar1;
  uVar3 = *(undefined4 *)
           &(args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent;
  (pCVar8->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)
   &(pCVar8->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar3;
  (pCVar8->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pCVar8->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pCVar8->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_00622e60;
  (pCVar8->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.childCount;
  sVar2 = (args->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  (pCVar8->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (args->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  (pCVar8->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (pCVar8->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_00623138;
  uVar3 = *(undefined4 *)&(args->qualifiers).super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->qualifiers).super_SyntaxListBase.super_SyntaxNode.parent;
  (pCVar8->qualifiers).super_SyntaxListBase.super_SyntaxNode.kind =
       (args->qualifiers).super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)&(pCVar8->qualifiers).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar3;
  (pCVar8->qualifiers).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pCVar8->qualifiers).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->qualifiers).super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pCVar8->qualifiers).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_00622e60;
  (pCVar8->qualifiers).super_SyntaxListBase.childCount =
       (args->qualifiers).super_SyntaxListBase.childCount;
  sVar2 = (args->qualifiers).super_span<slang::parsing::Token,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  (pCVar8->qualifiers).super_span<slang::parsing::Token,_18446744073709551615UL>._M_ptr =
       (args->qualifiers).super_span<slang::parsing::Token,_18446744073709551615UL>._M_ptr;
  (pCVar8->qualifiers).super_span<slang::parsing::Token,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (pCVar8->qualifiers).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_00622da0;
  TVar4 = (args->semi).kind;
  uVar5 = (args->semi).field_0x2;
  NVar6.raw = (args->semi).numFlags.raw;
  uVar7 = (args->semi).rawLen;
  (pCVar8->prototype).ptr = (args->prototype).ptr;
  (pCVar8->semi).kind = TVar4;
  (pCVar8->semi).field_0x2 = uVar5;
  (pCVar8->semi).numFlags = (NumericTokenFlags)NVar6.raw;
  (pCVar8->semi).rawLen = uVar7;
  (pCVar8->semi).info = (args->semi).info;
  return pCVar8;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }